

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

void encode_in_place(lzma_coder_conflict4 *coder,uint8_t *buffer,size_t size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  size_t sVar4;
  uint8_t tmp;
  size_t distance;
  size_t i;
  size_t size_local;
  uint8_t *buffer_local;
  lzma_coder_conflict4 *coder_local;
  
  sVar4 = coder->distance;
  for (distance = 0; distance < size; distance = distance + 1) {
    uVar1 = coder->history[sVar4 + coder->pos & 0xff];
    uVar2 = buffer[distance];
    bVar3 = coder->pos;
    coder->pos = bVar3 - 1;
    coder->history[(int)(uint)bVar3] = uVar2;
    buffer[distance] = buffer[distance] - uVar1;
  }
  return;
}

Assistant:

static void
encode_in_place(lzma_coder *coder, uint8_t *buffer, size_t size)
{
	size_t i;
	const size_t distance = coder->distance;

	for (i = 0; i < size; ++i) {
		const uint8_t tmp = coder->history[
				(distance + coder->pos) & 0xFF];
		coder->history[coder->pos-- & 0xFF] = buffer[i];
		buffer[i] -= tmp;
	}
}